

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextFilter::ImGuiTextFilter(ImGuiTextFilter *this,char *default_filter)

{
  (this->Filters).Size = 0;
  (this->Filters).Capacity = 0;
  (this->Filters).Data = (TextRange *)0x0;
  if (default_filter == (char *)0x0) {
    this->InputBuf[0] = '\0';
    this->CountGrep = 0;
  }
  else {
    ImStrncpy(this->InputBuf,default_filter,0x100);
    Build(this);
  }
  return;
}

Assistant:

ImGuiTextFilter::ImGuiTextFilter(const char* default_filter)
{
    if (default_filter)
    {
        ImStrncpy(InputBuf, default_filter, IM_ARRAYSIZE(InputBuf));
        Build();
    }
    else
    {
        InputBuf[0] = 0;
        CountGrep = 0;
    }
}